

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O2

int str_format(lua_State *L)

{
  byte *__src;
  undefined1 auVar1 [64];
  ushort *puVar2;
  byte bVar3;
  int arg;
  int iVar4;
  byte *pbVar5;
  void *pvVar6;
  char *pcVar7;
  size_t sVar8;
  size_t sVar9;
  char *pcVar10;
  ulong uVar11;
  undefined1 (*__s) [64];
  lconv *plVar12;
  undefined1 *puVar13;
  byte *pbVar14;
  byte *pbVar15;
  long lVar16;
  size_t sVar17;
  uint uVar18;
  size_t sVar19;
  undefined1 auVar20 [64];
  lua_Number lVar21;
  undefined1 (*local_20b8) [64];
  size_t l;
  undefined2 local_20a0;
  ushort **local_2098;
  undefined4 local_208c;
  char form [32];
  size_t local_2060;
  size_t sfl;
  luaL_Buffer b;
  
  local_208c = lua_gettop(L);
  pbVar5 = (byte *)luaL_checklstring(L,1,&sfl);
  pbVar15 = pbVar5 + sfl;
  luaL_buffinit(L,&b);
  iVar4 = 1;
LAB_0011a443:
  while( true ) {
    while( true ) {
      if (pbVar15 <= pbVar5) {
        luaL_pushresult(&b);
        return 1;
      }
      bVar3 = *pbVar5;
      if (bVar3 == 0x25) break;
      if (b.size <= b.n) {
        luaL_prepbuffsize(&b,1);
        bVar3 = *pbVar5;
      }
      pbVar5 = pbVar5 + 1;
      b.b[b.n] = bVar3;
      b.n = b.n + 1;
    }
    __src = pbVar5 + 1;
    if (pbVar5[1] != 0x25) break;
    bVar3 = 0x25;
    if (b.size <= b.n) {
      luaL_prepbuffsize(&b,1);
      bVar3 = *__src;
    }
    pbVar5 = pbVar5 + 2;
    b.b[b.n] = bVar3;
    b.n = b.n + 1;
  }
  local_20b8 = (undefined1 (*) [64])luaL_prepbuffsize(&b,0x78);
  arg = iVar4 + 1;
  if (local_208c <= iVar4) {
    iVar4 = luaL_argerror(L,arg,"no value");
    return iVar4;
  }
  lVar16 = 3;
  pbVar14 = __src;
  while( true ) {
    uVar18 = (uint)(char)*pbVar14;
    uVar11 = (ulong)uVar18;
    if ((uVar18 == 0) || (pvVar6 = memchr("-+ #0",uVar18,6), pvVar6 == (void *)0x0)) break;
    pbVar14 = pbVar14 + 1;
    lVar16 = lVar16 + 1;
  }
  if (5 < lVar16 - 3U) {
    luaL_error(L,"invalid format (repeated flags)");
    uVar11 = (ulong)*pbVar14;
  }
  local_2098 = __ctype_b_loc();
  puVar2 = *local_2098;
  uVar11 = (ulong)(puVar2[uVar11 & 0xff] >> 0xb & 1);
  lVar16 = (puVar2[pbVar14[uVar11]] >> 0xb & 1) + uVar11;
  bVar3 = pbVar14[lVar16];
  if (bVar3 == 0x2e) {
    pbVar5 = pbVar14 + lVar16 + 2;
    if ((*(byte *)((long)puVar2 + (ulong)pbVar14[lVar16 + 1] * 2 + 1) & 8) == 0) {
      pbVar5 = pbVar14 + lVar16 + 1;
    }
    pbVar5 = pbVar5 + ((puVar2[*pbVar5] >> 0xb & 1) != 0);
    bVar3 = *pbVar5;
  }
  else {
    pbVar5 = pbVar14 + lVar16;
  }
  if ((*(byte *)((long)puVar2 + (ulong)bVar3 * 2 + 1) & 8) != 0) {
    luaL_error(L,"invalid format (width or precision too long)");
  }
  form[0] = '%';
  memcpy(form + 1,__src,(size_t)(pbVar5 + (1 - (long)__src)));
  pbVar5[(long)(form + (2 - (long)__src))] = 0;
  bVar3 = *pbVar5;
  switch(bVar3) {
  case 0x58:
  case 100:
  case 0x69:
  case 0x6f:
  case 0x75:
  case 0x78:
    pcVar7 = (char *)luaL_checkinteger(L,arg);
    addlenmod(form,"ll");
    auVar20 = vpbroadcastb_avx512bw(ZEXT116(0xab));
    auVar1 = vmovdqu64_avx512f(auVar20);
    *(undefined1 (*) [64])(*local_20b8 + 0x38) = auVar1;
    auVar1 = vmovdqu64_avx512f(auVar20);
    *local_20b8 = auVar1;
    goto LAB_0011a670;
  case 0x59:
  case 0x5a:
  case 0x5b:
  case 0x5c:
  case 0x5d:
  case 0x5e:
  case 0x5f:
  case 0x60:
  case 0x62:
  case 0x68:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x6d:
  case 0x6e:
  case 0x72:
  case 0x74:
  case 0x76:
  case 0x77:
switchD_0011a623_caseD_59:
    iVar4 = luaL_error(L,"invalid conversion \'%s\' to \'format\'",form);
    return iVar4;
  case 0x61:
    goto switchD_0011a623_caseD_61;
  case 99:
    auVar20 = vpbroadcastb_avx512bw(ZEXT116(0xab));
    auVar1 = vmovdqu64_avx512f(auVar20);
    *(undefined1 (*) [64])(*local_20b8 + 0x38) = auVar1;
    auVar1 = vmovdqu64_avx512f(auVar20);
    *local_20b8 = auVar1;
    uVar11 = luaL_checkinteger(L,arg);
    iVar4 = snprintf((char *)local_20b8,0x78,form,uVar11 & 0xffffffff);
    break;
  case 0x65:
  case 0x67:
switchD_0011a623_caseD_65:
    uVar18 = 0x78;
    goto LAB_0011a96a;
  case 0x66:
    local_20b8 = (undefined1 (*) [64])luaL_prepbuffsize(&b,0x1a2);
    uVar18 = 0x1a2;
LAB_0011a96a:
    local_2098 = (ushort **)luaL_checknumber(L,arg);
    addlenmod(form,"");
    memset(local_20b8,0xab,(ulong)uVar18);
    iVar4 = snprintf((char *)local_20b8,(ulong)uVar18,form,local_2098);
    goto LAB_0011aa6d;
  case 0x70:
    pcVar7 = (char *)lua_topointer(L,arg);
    if (pcVar7 == (char *)0x0) {
      sVar9 = strlen(form);
      form[sVar9 - 1] = 's';
      pcVar7 = "(null)";
    }
    auVar20 = vpbroadcastb_avx512bw(ZEXT116(0xab));
    auVar1 = vmovdqu64_avx512f(auVar20);
    *(undefined1 (*) [64])(*local_20b8 + 0x38) = auVar1;
    auVar1 = vmovdqu64_avx512f(auVar20);
    *local_20b8 = auVar1;
LAB_0011a670:
    iVar4 = snprintf((char *)local_20b8,0x78,form,pcVar7);
    break;
  case 0x71:
    if (form[2] != '\0') {
      iVar4 = luaL_error(L,"specifier \'%%q\' cannot have modifiers");
      return iVar4;
    }
    uVar18 = lua_type(L,arg);
    if (uVar18 < 2) {
      iVar4 = 0;
      luaL_tolstring(L,arg,(size_t *)0x0);
      luaL_addvalue(&b);
    }
    else {
      if (uVar18 == 3) {
        __s = (undefined1 (*) [64])luaL_prepbuffsize(&b,0x78);
        iVar4 = lua_isinteger(L,arg);
        if (iVar4 == 0) {
          lVar21 = lua_tonumberx(L,arg,(int *)0x0);
          pcVar7 = "1e9999";
          if (((INFINITY <= lVar21) || (pcVar7 = "-1e9999", lVar21 <= -INFINITY)) ||
             (pcVar7 = "(0/0)", NAN(lVar21))) {
            auVar20 = vpbroadcastb_avx512bw(ZEXT116(0xab));
            auVar1 = vmovdqu64_avx512f(auVar20);
            *(undefined1 (*) [64])(*__s + 0x38) = auVar1;
            auVar1 = vmovdqu64_avx512f(auVar20);
            *__s = auVar1;
            pcVar10 = "%s";
            goto LAB_0011ac13;
          }
          auVar20 = vpbroadcastb_avx512bw(ZEXT116(0xab));
          auVar1 = vmovdqu64_avx512f(auVar20);
          *(undefined1 (*) [64])(*__s + 0x38) = auVar1;
          auVar1 = vmovdqu64_avx512f(auVar20);
          *__s = auVar1;
          iVar4 = snprintf((char *)__s,0x78,"%a","(0/0)");
          pvVar6 = memchr(__s,0x2e,(long)iVar4);
          if (pvVar6 == (void *)0x0) {
            plVar12 = localeconv();
            puVar13 = (undefined1 *)memchr(__s,(int)*plVar12->decimal_point,(long)iVar4);
            if (puVar13 != (undefined1 *)0x0) {
              *puVar13 = 0x2e;
            }
          }
        }
        else {
          pcVar7 = (char *)lua_tointegerx(L,arg,(int *)0x0);
          auVar20 = vpbroadcastb_avx512bw(ZEXT116(0xab));
          pcVar10 = "%lld";
          auVar1 = vmovdqu64_avx512f(auVar20);
          *__s = auVar1;
          auVar1 = vmovdqu64_avx512f(auVar20);
          *(undefined1 (*) [64])(*__s + 0x38) = auVar1;
LAB_0011ac13:
          iVar4 = snprintf((char *)__s,0x78,pcVar10,pcVar7);
        }
        b.n = b.n + (long)iVar4;
      }
      else if (uVar18 == 4) {
        pcVar7 = lua_tolstring(L,arg,&local_2060);
        sVar17 = local_2060;
        if (b.size <= b.n) {
          luaL_prepbuffsize(&b,1);
        }
        b.b[b.n] = '\"';
        b.n = b.n + 1;
        for (sVar19 = 0; sVar17 != sVar19; sVar19 = sVar19 + 1) {
          bVar3 = pcVar7[sVar19];
          if ((((ulong)bVar3 == 10) || (bVar3 == 0x5c)) || (bVar3 == 0x22)) {
            sVar8 = b.n;
            if (b.size <= b.n) {
              luaL_prepbuffsize(&b,1);
              sVar8 = b.n;
            }
            b.n = sVar8 + 1;
            b.b[sVar8] = '\\';
            if (b.size <= b.n) {
              luaL_prepbuffsize(&b,1);
            }
            b.b[b.n] = pcVar7[sVar19];
            b.n = b.n + 1;
          }
          else if (((*local_2098)[bVar3] & 2) == 0) {
            if (b.size <= b.n) {
              luaL_prepbuffsize(&b,1);
              bVar3 = pcVar7[sVar19];
            }
            b.b[b.n] = bVar3;
            b.n = b.n + 1;
          }
          else {
            local_20a0 = 0xabab;
            l = 0xabababababababab;
            pcVar10 = "\\%d";
            if (((*local_2098)[(byte)pcVar7[sVar19 + 1]] >> 0xb & 1) != 0) {
              pcVar10 = "\\%03d";
            }
            snprintf((char *)&l,10,pcVar10);
            luaL_addstring(&b,(char *)&l);
          }
        }
        if (b.size <= b.n) {
          luaL_prepbuffsize(&b,1);
        }
        b.b[b.n] = '\"';
        b.n = b.n + 1;
      }
      else {
        luaL_argerror(L,arg,"value has no literal form");
      }
      iVar4 = 0;
    }
    goto LAB_0011aa7b;
  case 0x73:
    pcVar7 = luaL_tolstring(L,arg,&l);
    sVar17 = l;
    if (form[2] == '\0') {
      luaL_addvalue(&b);
    }
    else {
      sVar9 = strlen(pcVar7);
      if (sVar17 != sVar9) {
        luaL_argerror(L,arg,"string contains zeros");
        sVar17 = l;
      }
      pcVar10 = strchr(form,0x2e);
      if ((pcVar10 != (char *)0x0) || (sVar17 < 100)) {
        auVar20 = vpbroadcastb_avx512bw(ZEXT116(0xab));
        auVar1 = vmovdqu64_avx512f(auVar20);
        *(undefined1 (*) [64])(*local_20b8 + 0x38) = auVar1;
        auVar1 = vmovdqu64_avx512f(auVar20);
        *local_20b8 = auVar1;
        iVar4 = snprintf((char *)local_20b8,0x78,form,pcVar7);
        lua_settop(L,-2);
        break;
      }
      luaL_addvalue(&b);
    }
    iVar4 = 0;
    break;
  default:
    if (bVar3 != 0x41) {
      if (bVar3 == 0x45) goto switchD_0011a623_caseD_65;
      uVar18 = 0x78;
      if (bVar3 != 0x47) goto switchD_0011a623_caseD_59;
      goto LAB_0011a96a;
    }
    goto switchD_0011a623_caseD_61;
  }
LAB_0011aa69:
  uVar18 = 0x78;
LAB_0011aa6d:
  if ((int)uVar18 <= iVar4) {
    __assert_fail("nb < maxitem",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lstrlib.c"
                  ,0x51d,"int str_format(lua_State *)");
  }
LAB_0011aa7b:
  pbVar5 = pbVar5 + 1;
  b.n = b.n + (long)iVar4;
  iVar4 = arg;
  goto LAB_0011a443;
switchD_0011a623_caseD_61:
  addlenmod(form,"");
  auVar20 = vpbroadcastb_avx512bw(ZEXT116(0xab));
  auVar1 = vmovdqu64_avx512f(auVar20);
  *(undefined1 (*) [64])(*local_20b8 + 0x38) = auVar1;
  auVar1 = vmovdqu64_avx512f(auVar20);
  *local_20b8 = auVar1;
  luaL_checknumber(L,arg);
  iVar4 = snprintf((char *)local_20b8,0x78,form);
  goto LAB_0011aa69;
}

Assistant:

static int str_format (lua_State *L) {
  int top = lua_gettop(L);
  int arg = 1;
  size_t sfl;
  const char *strfrmt = luaL_checklstring(L, arg, &sfl);
  const char *strfrmt_end = strfrmt+sfl;
  luaL_Buffer b;
  luaL_buffinit(L, &b);
  while (strfrmt < strfrmt_end) {
    if (*strfrmt != L_ESC)
      luaL_addchar(&b, *strfrmt++);
    else if (*++strfrmt == L_ESC)
      luaL_addchar(&b, *strfrmt++);  /* %% */
    else { /* format item */
      char form[MAX_FORMAT];  /* to store the format ('%...') */
      int maxitem = MAX_ITEM;
      char *buff = luaL_prepbuffsize(&b, maxitem);  /* to put formatted item */
      int nb = 0;  /* number of bytes in added item */
      if (++arg > top)
        return luaL_argerror(L, arg, "no value");
      strfrmt = scanformat(L, strfrmt, form);
      switch (*strfrmt++) {
        case 'c': {
          nb = l_sprintf(buff, maxitem, form, (int)luaL_checkinteger(L, arg));
          break;
        }
        case 'd': case 'i':
        case 'o': case 'u': case 'x': case 'X': {
          lua_Integer n = luaL_checkinteger(L, arg);
          addlenmod(form, LUA_INTEGER_FRMLEN);
          nb = l_sprintf(buff, maxitem, form, (LUAI_UACINT)n);
          break;
        }
        case 'a': case 'A':
          addlenmod(form, LUA_NUMBER_FRMLEN);
          nb = lua_number2strx(L, buff, maxitem, form,
                                  luaL_checknumber(L, arg));
          break;
        case 'f':
          maxitem = MAX_ITEMF;  /* extra space for '%f' */
          buff = luaL_prepbuffsize(&b, maxitem);
          /* FALLTHROUGH */
        case 'e': case 'E': case 'g': case 'G': {
          lua_Number n = luaL_checknumber(L, arg);
          addlenmod(form, LUA_NUMBER_FRMLEN);
          nb = l_sprintf(buff, maxitem, form, (LUAI_UACNUMBER)n);
          break;
        }
        case 'p': {
          const void *p = lua_topointer(L, arg);
          if (p == NULL) {  /* avoid calling 'printf' with argument NULL */
            p = "(null)";  /* result */
            form[strlen(form) - 1] = 's';  /* format it as a string */
          }
          nb = l_sprintf(buff, maxitem, form, p);
          break;
        }
        case 'q': {
          if (form[2] != '\0')  /* modifiers? */
            return luaL_error(L, "specifier '%%q' cannot have modifiers");
          addliteral(L, &b, arg);
          break;
        }
        case 's': {
          size_t l;
          const char *s = luaL_tolstring(L, arg, &l);
          if (form[2] == '\0')  /* no modifiers? */
            luaL_addvalue(&b);  /* keep entire string */
          else {
            luaL_argcheck(L, l == strlen(s), arg, "string contains zeros");
            if (!strchr(form, '.') && l >= 100) {
              /* no precision and string is too long to be formatted */
              luaL_addvalue(&b);  /* keep entire string */
            }
            else {  /* format the string into 'buff' */
              nb = l_sprintf(buff, maxitem, form, s);
              lua_pop(L, 1);  /* remove result from 'luaL_tolstring' */
            }
          }
          break;
        }
        default: {  /* also treat cases 'pnLlh' */
          return luaL_error(L, "invalid conversion '%s' to 'format'", form);
        }
      }
      lua_assert(nb < maxitem);
      luaL_addsize(&b, nb);
    }
  }
  luaL_pushresult(&b);
  return 1;
}